

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# get_perm_c.c
# Opt level: O0

void at_plus_a(int n,int_t nz,int_t *colptr,int_t *rowind,int_t *bnz,int_t **b_colptr,
              int_t **b_rowind)

{
  int iVar1;
  void *addr;
  undefined4 *addr_00;
  void *addr_01;
  int_t *piVar2;
  char local_568 [8];
  char msg_4 [256];
  char msg_3 [256];
  char msg_2 [256];
  char msg_1 [256];
  char msg [256];
  int_t *marker;
  int_t *t_rowind;
  int_t *t_colptr;
  int_t num_nz;
  int_t col;
  int_t k;
  int_t j;
  int_t i;
  int_t **b_colptr_local;
  int_t *bnz_local;
  int_t *rowind_local;
  int_t *colptr_local;
  int_t nz_local;
  int n_local;
  
  addr = superlu_malloc((long)n << 2);
  if (addr == (void *)0x0) {
    sprintf(msg_1 + 0xf8,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for marker[]",0x123,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/get_perm_c.c")
    ;
    superlu_abort_and_exit(msg_1 + 0xf8);
  }
  addr_00 = (undefined4 *)superlu_malloc((long)(n + 1) << 2);
  if (addr_00 == (undefined4 *)0x0) {
    sprintf(msg_2 + 0xf8,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for t_colptr[]",0x125,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/get_perm_c.c")
    ;
    superlu_abort_and_exit(msg_2 + 0xf8);
  }
  addr_01 = superlu_malloc((long)nz << 2);
  if (addr_01 == (void *)0x0) {
    sprintf(msg_3 + 0xf8,"%s at line %d in file %s\n","SUPERLU_MALLOC fails t_rowind[]",0x127,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/get_perm_c.c")
    ;
    superlu_abort_and_exit(msg_3 + 0xf8);
  }
  for (k = 0; k < n; k = k + 1) {
    *(undefined4 *)((long)addr + (long)k * 4) = 0;
  }
  for (col = 0; col < n; col = col + 1) {
    for (k = colptr[col]; k < colptr[col + 1]; k = k + 1) {
      *(int *)((long)addr + (long)rowind[k] * 4) = *(int *)((long)addr + (long)rowind[k] * 4) + 1;
    }
  }
  *addr_00 = 0;
  for (k = 0; k < n; k = k + 1) {
    addr_00[k + 1] = addr_00[k] + *(int *)((long)addr + (long)k * 4);
    *(undefined4 *)((long)addr + (long)k * 4) = addr_00[k];
  }
  for (col = 0; col < n; col = col + 1) {
    for (k = colptr[col]; k < colptr[col + 1]; k = k + 1) {
      iVar1 = rowind[k];
      *(int_t *)((long)addr_01 + (long)*(int *)((long)addr + (long)iVar1 * 4) * 4) = col;
      *(int *)((long)addr + (long)iVar1 * 4) = *(int *)((long)addr + (long)iVar1 * 4) + 1;
    }
  }
  for (k = 0; k < n; k = k + 1) {
    *(undefined4 *)((long)addr + (long)k * 4) = 0xffffffff;
  }
  t_colptr._4_4_ = 0;
  for (col = 0; col < n; col = col + 1) {
    *(int_t *)((long)addr + (long)col * 4) = col;
    for (k = colptr[col]; k < colptr[col + 1]; k = k + 1) {
      if (*(int *)((long)addr + (long)rowind[k] * 4) != col) {
        *(int_t *)((long)addr + (long)rowind[k] * 4) = col;
        t_colptr._4_4_ = t_colptr._4_4_ + 1;
      }
    }
    for (k = addr_00[col]; k < (int)addr_00[col + 1]; k = k + 1) {
      iVar1 = *(int *)((long)addr_01 + (long)k * 4);
      if (*(int *)((long)addr + (long)iVar1 * 4) != col) {
        *(int_t *)((long)addr + (long)iVar1 * 4) = col;
        t_colptr._4_4_ = t_colptr._4_4_ + 1;
      }
    }
  }
  *bnz = t_colptr._4_4_;
  piVar2 = (int_t *)superlu_malloc((long)(n + 1) << 2);
  *b_colptr = piVar2;
  if (piVar2 == (int_t *)0x0) {
    sprintf(msg_4 + 0xf8,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for b_colptr[]",0x166,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/get_perm_c.c")
    ;
    superlu_abort_and_exit(msg_4 + 0xf8);
  }
  if (*bnz != 0) {
    piVar2 = (int_t *)superlu_malloc((long)*bnz << 2);
    *b_rowind = piVar2;
    if (piVar2 == (int_t *)0x0) {
      sprintf(local_568,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for b_rowind[]",0x169,
              "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/get_perm_c.c"
             );
      superlu_abort_and_exit(local_568);
    }
  }
  for (k = 0; k < n; k = k + 1) {
    *(undefined4 *)((long)addr + (long)k * 4) = 0xffffffff;
  }
  t_colptr._4_4_ = 0;
  for (col = 0; col < n; col = col + 1) {
    (*b_colptr)[col] = t_colptr._4_4_;
    *(int_t *)((long)addr + (long)col * 4) = col;
    for (k = colptr[col]; k < colptr[col + 1]; k = k + 1) {
      iVar1 = rowind[k];
      if (*(int *)((long)addr + (long)iVar1 * 4) != col) {
        *(int_t *)((long)addr + (long)iVar1 * 4) = col;
        (*b_rowind)[t_colptr._4_4_] = iVar1;
        t_colptr._4_4_ = t_colptr._4_4_ + 1;
      }
    }
    for (k = addr_00[col]; k < (int)addr_00[col + 1]; k = k + 1) {
      iVar1 = *(int *)((long)addr_01 + (long)k * 4);
      if (*(int *)((long)addr + (long)iVar1 * 4) != col) {
        *(int_t *)((long)addr + (long)iVar1 * 4) = col;
        (*b_rowind)[t_colptr._4_4_] = iVar1;
        t_colptr._4_4_ = t_colptr._4_4_ + 1;
      }
    }
  }
  (*b_colptr)[n] = t_colptr._4_4_;
  superlu_free(addr);
  superlu_free(addr_00);
  superlu_free(addr_01);
  return;
}

Assistant:

void at_plus_a(const int n, const int_t nz, const int_t *colptr, const int_t *rowind,
               int_t *bnz, int_t **b_colptr, int_t **b_rowind)
{
    register int_t i, j, k, col, num_nz;
    int_t *t_colptr, *t_rowind; /* a column oriented form of T = A' */
    int_t *marker;

    if ( !(marker = (int_t*) SUPERLU_MALLOC( n * sizeof(int_t)) ) )
	ABORT("SUPERLU_MALLOC fails for marker[]");
    if ( !(t_colptr = (int_t*) SUPERLU_MALLOC( (n+1) * sizeof(int_t)) ) )
	ABORT("SUPERLU_MALLOC fails for t_colptr[]");
    if ( !(t_rowind = (int_t*) SUPERLU_MALLOC( nz * sizeof(int_t)) ) )
	ABORT("SUPERLU_MALLOC fails t_rowind[]");

    
    /* Get counts of each column of T, and set up column pointers */
    for (i = 0; i < n; ++i) marker[i] = 0;
    for (j = 0; j < n; ++j) {
	for (i = colptr[j]; i < colptr[j+1]; ++i)
	    ++marker[rowind[i]];
    }
    t_colptr[0] = 0;
    for (i = 0; i < n; ++i) {
	t_colptr[i+1] = t_colptr[i] + marker[i];
	marker[i] = t_colptr[i];
    }

    /* Transpose the matrix from A to T */
    for (j = 0; j < n; ++j)
	for (i = colptr[j]; i < colptr[j+1]; ++i) {
	    col = rowind[i];
	    t_rowind[marker[col]] = j;
	    ++marker[col];
	}


    /* ----------------------------------------------------------------
       compute B = A + T, where column j of B is:

       Struct (B_*j) = Struct (A_*k) UNION Struct (T_*k)

       do not include the diagonal entry
       ---------------------------------------------------------------- */

    /* Zero the diagonal flag */
    for (i = 0; i < n; ++i) marker[i] = -1;

    /* First pass determines number of nonzeros in B */
    num_nz = 0;
    for (j = 0; j < n; ++j) {
	/* Flag the diagonal so it's not included in the B matrix */
	marker[j] = j;

	/* Add pattern of column A_*k to B_*j */
	for (i = colptr[j]; i < colptr[j+1]; ++i) {
	    k = rowind[i];
	    if ( marker[k] != j ) {
		marker[k] = j;
		++num_nz;
	    }
	}

	/* Add pattern of column T_*k to B_*j */
	for (i = t_colptr[j]; i < t_colptr[j+1]; ++i) {
	    k = t_rowind[i];
	    if ( marker[k] != j ) {
		marker[k] = j;
		++num_nz;
	    }
	}
    }
    *bnz = num_nz;
    
    /* Allocate storage for A+A' */
    if ( !(*b_colptr = (int_t*) SUPERLU_MALLOC( (n+1) * sizeof(int_t)) ) )
	ABORT("SUPERLU_MALLOC fails for b_colptr[]");
    if ( *bnz) {
      if ( !(*b_rowind = (int_t*) SUPERLU_MALLOC( *bnz * sizeof(int_t)) ) )
	ABORT("SUPERLU_MALLOC fails for b_rowind[]");
    }
    
    /* Zero the diagonal flag */
    for (i = 0; i < n; ++i) marker[i] = -1;
    
    /* Compute each column of B, one at a time */
    num_nz = 0;
    for (j = 0; j < n; ++j) {
	(*b_colptr)[j] = num_nz;
	
	/* Flag the diagonal so it's not included in the B matrix */
	marker[j] = j;

	/* Add pattern of column A_*k to B_*j */
	for (i = colptr[j]; i < colptr[j+1]; ++i) {
	    k = rowind[i];
	    if ( marker[k] != j ) {
		marker[k] = j;
		(*b_rowind)[num_nz++] = k;
	    }
	}

	/* Add pattern of column T_*k to B_*j */
	for (i = t_colptr[j]; i < t_colptr[j+1]; ++i) {
	    k = t_rowind[i];
	    if ( marker[k] != j ) {
		marker[k] = j;
		(*b_rowind)[num_nz++] = k;
	    }
	}
    }
    (*b_colptr)[n] = num_nz;
       
    SUPERLU_FREE(marker);
    SUPERLU_FREE(t_colptr);
    SUPERLU_FREE(t_rowind);
}